

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall
clipp::parser::try_match_full<clipp::detail::select_flags>
          (parser *this,arg_string *arg,select_flags *select)

{
  bool bVar1;
  match_t *in_RDI;
  match_t match;
  scoped_dfs_traverser *in_stack_fffffffffffffe88;
  scoped_dfs_traverser *in_stack_fffffffffffffe90;
  select_flags *in_stack_ffffffffffffff58;
  arg_string *in_stack_ffffffffffffff60;
  scoped_dfs_traverser *in_stack_ffffffffffffff68;
  match_t *in_stack_ffffffffffffffb8;
  parser *in_stack_ffffffffffffffc0;
  
  detail::scoped_dfs_traverser::scoped_dfs_traverser
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  detail::full_match<clipp::detail::select_flags>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser((scoped_dfs_traverser *)in_RDI);
  bVar1 = detail::match_t::operator_cast_to_bool((match_t *)0x19258a);
  if (bVar1) {
    add_match(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  detail::match_t::~match_t(in_RDI);
  return bVar1;
}

Assistant:

bool try_match_full(const arg_string& arg, const ParamSelector& select)
    {
        auto match = detail::full_match(pos_, arg, select);
        if(!match) return false;
        add_match(match);
        return true;
    }